

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams
          (BiDirectionalLSTMLayerParams *this)

{
  InternalMetadata *this_00;
  LSTMParams *this_01;
  ulong uVar1;
  undefined8 *puVar2;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    if (this != (BiDirectionalLSTMLayerParams *)_BiDirectionalLSTMLayerParams_default_instance_) {
      this_01 = this->params_;
      if (this_01 != (LSTMParams *)0x0) {
        LSTMParams::~LSTMParams(this_01);
      }
      operator_delete(this_01,0x20);
      uVar1 = this_00->ptr_;
    }
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
                (this_00);
    }
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::~RepeatedPtrField
            (&this->weightparams_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::~RepeatedPtrField
            (&this->activationsbackwardlstm_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::~RepeatedPtrField
            (&this->activationsforwardlstm_);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  google::protobuf::internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BiDirectionalLSTMLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}